

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_disk_posix.c
# Opt level: O0

void tree_push(tree *t,char *path,wchar_t filesystem_id,int64_t dev,int64_t ino,restore_time *rt)

{
  tree_entry *ptVar1;
  size_t local_58;
  tree_entry *te;
  restore_time *rt_local;
  int64_t ino_local;
  int64_t dev_local;
  wchar_t filesystem_id_local;
  char *path_local;
  tree *t_local;
  
  ptVar1 = (tree_entry *)calloc(1,0x88);
  ptVar1->next = t->stack;
  ptVar1->parent = t->current;
  if (ptVar1->parent != (tree_entry *)0x0) {
    ptVar1->depth = ptVar1->parent->depth + 1;
  }
  t->stack = ptVar1;
  (ptVar1->name).s = (char *)0x0;
  (ptVar1->name).length = 0;
  (ptVar1->name).buffer_length = 0;
  ptVar1->symlink_parent_fd = -1;
  (ptVar1->name).length = 0;
  if (path == (char *)0x0) {
    local_58 = 0;
  }
  else {
    local_58 = strlen(path);
  }
  archive_strncat(&ptVar1->name,path,local_58);
  ptVar1->flags = 0x38;
  ptVar1->filesystem_id = filesystem_id;
  ptVar1->dev = dev;
  ptVar1->ino = ino;
  ptVar1->dirname_length = t->dirname_length;
  (ptVar1->restore_time).name = (ptVar1->name).s;
  if (rt != (restore_time *)0x0) {
    (ptVar1->restore_time).mtime = rt->mtime;
    (ptVar1->restore_time).mtime_nsec = rt->mtime_nsec;
    (ptVar1->restore_time).atime = rt->atime;
    (ptVar1->restore_time).atime_nsec = rt->atime_nsec;
    (ptVar1->restore_time).filetype = rt->filetype;
    (ptVar1->restore_time).noatime = rt->noatime;
  }
  return;
}

Assistant:

static void
tree_push(struct tree *t, const char *path, int filesystem_id,
    int64_t dev, int64_t ino, struct restore_time *rt)
{
	struct tree_entry *te;

	te = calloc(1, sizeof(*te));
	te->next = t->stack;
	te->parent = t->current;
	if (te->parent)
		te->depth = te->parent->depth + 1;
	t->stack = te;
	archive_string_init(&te->name);
	te->symlink_parent_fd = -1;
	archive_strcpy(&te->name, path);
	te->flags = needsDescent | needsOpen | needsAscent;
	te->filesystem_id = filesystem_id;
	te->dev = dev;
	te->ino = ino;
	te->dirname_length = t->dirname_length;
	te->restore_time.name = te->name.s;
	if (rt != NULL) {
		te->restore_time.mtime = rt->mtime;
		te->restore_time.mtime_nsec = rt->mtime_nsec;
		te->restore_time.atime = rt->atime;
		te->restore_time.atime_nsec = rt->atime_nsec;
		te->restore_time.filetype = rt->filetype;
		te->restore_time.noatime = rt->noatime;
	}
}